

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsicsSampled.cpp
# Opt level: O2

string * __thiscall
vkt::sparse::SparseCaseOpImageSparseSampleImplicitLod::sparseImageOpString
          (string *__return_storage_ptr__,SparseCaseOpImageSparseSampleImplicitLod *this,
          string *resultVariable,string *resultType,string *image,string *coord,string *miplevel)

{
  ostream *poVar1;
  ostringstream src;
  ostringstream aoStack_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  poVar1 = std::operator<<((ostream *)aoStack_1a8,(string *)resultVariable);
  poVar1 = std::operator<<(poVar1," = OpImageSparseSampleImplicitLod ");
  poVar1 = std::operator<<(poVar1,(string *)resultType);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)image);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)coord);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string	SparseCaseOpImageSparseSampleImplicitLod::sparseImageOpString  (const std::string& resultVariable,
																			const std::string& resultType,
																			const std::string& image,
																			const std::string& coord,
																			const std::string& miplevel) const
{
	DE_UNREF(miplevel);

	std::ostringstream	src;

	src << resultVariable << " = OpImageSparseSampleImplicitLod " << resultType << " " << image << " " << coord << "\n";

	return src.str();
}